

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall
MT32Emu::Synth::playMsgOnPart(Synth *this,Bit8u part,Bit8u code,Bit8u note,Bit8u velocity)

{
  Bit8u BVar1;
  Part *pPVar2;
  
  if (this->opened != true) {
switchD_0017b586_caseD_a:
    return;
  }
  if (this->activated == false) {
    this->activated = true;
  }
  switch(code) {
  case '\b':
    pPVar2 = this->parts[part];
    break;
  case '\t':
    pPVar2 = this->parts[part];
    if (velocity != '\0') {
      BVar1 = Part::getVolumeOverride(pPVar2);
      if (BVar1 != '\0') {
        (*this->parts[part]->_vptr_Part[2])(this->parts[part],(ulong)note,(ulong)velocity);
      }
      goto LAB_0017b696;
    }
    break;
  default:
    goto switchD_0017b586_caseD_a;
  case '\v':
    if (note < 100) {
      switch(note) {
      case '\x01':
        Part::setModulation(this->parts[part],(uint)velocity);
        break;
      case '\x02':
      case '\x03':
      case '\x04':
      case '\x05':
      case '\b':
      case '\t':
        goto switchD_0017b586_caseD_a;
      case '\x06':
        Part::setDataEntryMSB(this->parts[part],velocity);
        break;
      case '\a':
        Part::setVolume(this->parts[part],(uint)velocity);
        break;
      case '\n':
        (*this->parts[part]->_vptr_Part[4])(this->parts[part],(ulong)velocity);
        break;
      case '\v':
        Part::setExpression(this->parts[part],(uint)velocity);
        break;
      default:
        if (note - 0x62 < 2) {
          Part::setNRPN(this->parts[part]);
        }
        else {
          if (note != '@') {
            return;
          }
          Part::setHoldPedal(this->parts[part],0x3f < velocity);
        }
      }
    }
    else if (note < 0x7b) {
      if (note == 'd') {
        Part::setRPNLSB(this->parts[part],velocity);
      }
      else if (note == 'e') {
        Part::setRPNMSB(this->parts[part],velocity);
      }
      else {
        if (note != 'y') {
          return;
        }
        Part::resetAllControllers(this->parts[part]);
      }
    }
    else {
      if (note - 0x7c < 4) {
        Part::setHoldPedal(this->parts[part],false);
        pPVar2 = this->parts[part];
      }
      else {
        if (note != '{') {
          return;
        }
        pPVar2 = this->parts[part];
      }
      Part::allNotesOff(pPVar2);
    }
    goto LAB_0017b683;
  case '\f':
    (*this->parts[part]->_vptr_Part[5])(this->parts[part],(ulong)note);
    if (part < 8) {
      Display::midiMessagePlayed(this->extensions->display);
      Display::programChanged(this->extensions->display,part);
    }
    goto LAB_0017b696;
  case '\x0e':
    Part::setBend(this->parts[part],(uint)note | (uint)velocity << 7);
LAB_0017b683:
    Display::midiMessagePlayed(this->extensions->display);
    goto LAB_0017b696;
  }
  (*pPVar2->_vptr_Part[3])(pPVar2,(ulong)note);
LAB_0017b696:
  (*this->reportHandler->_vptr_ReportHandler[6])();
  return;
}

Assistant:

void Synth::playMsgOnPart(Bit8u part, Bit8u code, Bit8u note, Bit8u velocity) {
	if (!opened) return;

	Bit32u bend;

	if (!activated) activated = true;
	//printDebug("Synth::playMsgOnPart(%02x, %02x, %02x, %02x)", part, code, note, velocity);
	switch (code) {
	case 0x8:
		//printDebug("Note OFF - Part %d", part);
		// The MT-32 ignores velocity for note off
		parts[part]->noteOff(note);
		break;
	case 0x9:
		//printDebug("Note ON - Part %d, Note %d Vel %d", part, note, velocity);
		if (velocity == 0) {
			// MIDI defines note-on with velocity 0 as being the same as note-off with velocity 40
			parts[part]->noteOff(note);
		} else if (parts[part]->getVolumeOverride() > 0) {
			parts[part]->noteOn(note, velocity);
		}
		break;
	case 0xB: // Control change
		switch (note) {
		case 0x01:  // Modulation
			//printDebug("Modulation: %d", velocity);
			parts[part]->setModulation(velocity);
			break;
		case 0x06:
			parts[part]->setDataEntryMSB(velocity);
			break;
		case 0x07:  // Set volume
			//printDebug("Volume set: %d", velocity);
			parts[part]->setVolume(velocity);
			break;
		case 0x0A:  // Pan
			//printDebug("Pan set: %d", velocity);
			parts[part]->setPan(velocity);
			break;
		case 0x0B:
			//printDebug("Expression set: %d", velocity);
			parts[part]->setExpression(velocity);
			break;
		case 0x40: // Hold (sustain) pedal
			//printDebug("Hold pedal set: %d", velocity);
			parts[part]->setHoldPedal(velocity >= 64);
			break;

		case 0x62:
		case 0x63:
			parts[part]->setNRPN();
			break;
		case 0x64:
			parts[part]->setRPNLSB(velocity);
			break;
		case 0x65:
			parts[part]->setRPNMSB(velocity);
			break;

		case 0x79: // Reset all controllers
			//printDebug("Reset all controllers");
			parts[part]->resetAllControllers();
			break;

		case 0x7B: // All notes off
			//printDebug("All notes off");
			parts[part]->allNotesOff();
			break;

		case 0x7C:
		case 0x7D:
		case 0x7E:
		case 0x7F:
			// CONFIRMED:Mok: A real LAPC-I responds to these controllers as follows:
			parts[part]->setHoldPedal(false);
			parts[part]->allNotesOff();
			break;

		default:
#if MT32EMU_MONITOR_MIDI > 0
			printDebug("Unknown MIDI Control code: 0x%02x - vel 0x%02x", note, velocity);
#endif
			return;
		}
		extensions.display->midiMessagePlayed();
		break;
	case 0xC: // Program change
		//printDebug("Program change %01x", note);
		parts[part]->setProgram(note);
		if (part < 8) {
			extensions.display->midiMessagePlayed();
			extensions.display->programChanged(part);
		}
		break;
	case 0xE: // Pitch bender
		bend = (velocity << 7) | (note);
		//printDebug("Pitch bender %02x", bend);
		parts[part]->setBend(bend);
		extensions.display->midiMessagePlayed();
		break;
	default:
#if MT32EMU_MONITOR_MIDI > 0
		printDebug("Unknown Midi code: 0x%01x - %02x - %02x", code, note, velocity);
#endif
		return;
	}
	reportHandler->onMIDIMessagePlayed();
}